

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_3e90a3a::TRDescriptor::ToStringSubScriptHelper
          (TRDescriptor *this,SigningProvider *arg,string *ret,StringType type,
          DescriptorCache *cache)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  _Var3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  _Bit_type *p_Var7;
  long in_FS_OFFSET;
  bool bVar8;
  reference rVar9;
  vector<bool,_std::allocator<bool>_> path;
  string tmp;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    bVar8 = true;
  }
  else {
    path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    for (uVar6 = 0;
        bVar8 = (ulong)((long)(this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                        (long)(this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start >> 2) <= uVar6, !bVar8;
        uVar6 = uVar6 + 1) {
      if (uVar6 != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (ret,',');
      }
      while (lVar1 = (ulong)path.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)path.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)path.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
            (int)lVar1 <=
            (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6]) {
        if (lVar1 != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (ret,'{');
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(&path,false);
      }
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      _Var3._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
      .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl =
           (this->super_DescriptorImpl).m_subdescriptor_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
           ._M_t;
      cVar4 = (**(code **)(*(long *)_Var3._M_t.
                                    super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                    .
                                    super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>
                                    ._M_head_impl + 0x98))
                        (_Var3._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
                         _M_head_impl,arg,&tmp,type,cache);
      if (cVar4 == '\0') {
        std::__cxx11::string::~string((string *)&tmp);
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (ret,&tmp);
      while ((path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p !=
              path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p ||
             (path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset != 0))) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::back(&path);
        p_Var7 = path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_p;
        uVar5 = path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset;
        if ((*rVar9._M_p & rVar9._M_mask) == 0) goto LAB_00ac8465;
        if (1 < (ulong)path.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                ((long)path.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)path.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (ret,'}');
        }
        bVar8 = path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset == 0;
        path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_offset =
             path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset - 1;
        if (bVar8) {
          path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
          .super__Bit_iterator_base._M_offset = 0x3f;
          path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
          .super__Bit_iterator_base._M_p =
               path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p + -1;
        }
      }
      uVar5 = 0;
      p_Var7 = path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
LAB_00ac8465:
      if (path.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
          super__Bit_iterator_base._M_p != p_Var7 || uVar5 != 0) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::back(&path);
        *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
      }
      std::__cxx11::string::~string((string *)&tmp);
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&path.super__Bvector_base<std::allocator<bool>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool ToStringSubScriptHelper(const SigningProvider* arg, std::string& ret, const StringType type, const DescriptorCache* cache = nullptr) const override
    {
        if (m_depths.empty()) return true;
        std::vector<bool> path;
        for (size_t pos = 0; pos < m_depths.size(); ++pos) {
            if (pos) ret += ',';
            while ((int)path.size() <= m_depths[pos]) {
                if (path.size()) ret += '{';
                path.push_back(false);
            }
            std::string tmp;
            if (!m_subdescriptor_args[pos]->ToStringHelper(arg, tmp, type, cache)) return false;
            ret += tmp;
            while (!path.empty() && path.back()) {
                if (path.size() > 1) ret += '}';
                path.pop_back();
            }
            if (!path.empty()) path.back() = true;
        }
        return true;
    }